

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_heter_queue.h
# Opt level: O0

Data * __thiscall
density::
lf_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)0>
::reentrant_consume_operation::
element<density_tests::detail::PutRawBlocks<density::lf_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)0>>::Data>
          (reentrant_consume_operation *this)

{
  LfQueueControl *i_control;
  bool bVar1;
  runtime_type<> *this_00;
  Data *pDVar2;
  reentrant_consume_operation *this_local;
  
  bVar1 = lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
          ::reentrant_consume_operation::empty((reentrant_consume_operation *)this);
  if (!bVar1) {
    this_00 = lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
              ::reentrant_consume_operation::complete_type((reentrant_consume_operation *)this);
    bVar1 = runtime_type<>::
            is<density_tests::detail::PutRawBlocks<density::lf_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)0>>::Data>
                      (this_00);
    if (bVar1) goto LAB_0255d140;
  }
  density_tests::detail::assert_failed<>
            ("!empty() && complete_type().template is<COMPLETE_ELEMENT_TYPE>()",
             "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/lf_heter_queue.h"
             ,0xa3f);
LAB_0255d140:
  i_control = *(LfQueueControl **)(this + 8);
  bVar1 = detail::
          LFQueue_Head<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>_>
          ::Consume::external((Consume *)this);
  pDVar2 = (Data *)detail::
                   LFQueue_Base<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_density::detail::LFQueue_Tail<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>_>
                   ::get_element(i_control,bVar1);
  return pDVar2;
}

Assistant:

COMPLETE_ELEMENT_TYPE & element() const noexcept
            {
                DENSITY_ASSERT(!empty() && complete_type().template is<COMPLETE_ELEMENT_TYPE>());
                return *static_cast<COMPLETE_ELEMENT_TYPE *>(
                  Base::get_element(m_consume_data.m_control, m_consume_data.external()));
            }